

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Clara::CommandLine<Catch::ConfigData>::Arg::hasShortName(Arg *this,string *shortName)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  pointer pbVar3;
  
  pbVar3 = (this->shortNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->shortNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    __s2 = (shortName->_M_dataplus)._M_p;
    __n = shortName->_M_string_length;
    do {
      if (pbVar3->_M_string_length == __n) {
        if (__n == 0) {
          return true;
        }
        iVar2 = bcmp((pbVar3->_M_dataplus)._M_p,__s2,__n);
        if (iVar2 == 0) {
          return true;
        }
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  return false;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }